

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMem.c
# Opt level: O0

char * Gia_MmFixedEntryFetch(Gia_MmFixed_t *p)

{
  int iVar1;
  char *pcVar2;
  char **local_28;
  int local_1c;
  long *plStack_18;
  int i;
  char *pTemp;
  Gia_MmFixed_t *p_local;
  
  if (p->nEntriesUsed == p->nEntriesAlloc) {
    if (p->pEntriesFree != (char *)0x0) {
      __assert_fail("p->pEntriesFree == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMem.c"
                    ,0xa9,"char *Gia_MmFixedEntryFetch(Gia_MmFixed_t *)");
    }
    if (p->nChunks == p->nChunksAlloc) {
      p->nChunksAlloc = p->nChunksAlloc << 1;
      if (p->pChunks == (char **)0x0) {
        local_28 = (char **)malloc((long)p->nChunksAlloc << 3);
      }
      else {
        local_28 = (char **)realloc(p->pChunks,(long)p->nChunksAlloc << 3);
      }
      p->pChunks = local_28;
    }
    pcVar2 = (char *)malloc((long)(p->nEntrySize * p->nChunkSize));
    p->pEntriesFree = pcVar2;
    p->nMemoryAlloc = p->nEntrySize * p->nChunkSize + p->nMemoryAlloc;
    plStack_18 = (long *)p->pEntriesFree;
    for (local_1c = 1; local_1c < p->nChunkSize; local_1c = local_1c + 1) {
      *plStack_18 = (long)plStack_18 + (long)p->nEntrySize;
      plStack_18 = (long *)((long)plStack_18 + (long)p->nEntrySize);
    }
    *plStack_18 = 0;
    iVar1 = p->nChunks;
    p->nChunks = iVar1 + 1;
    p->pChunks[iVar1] = p->pEntriesFree;
    p->nEntriesAlloc = p->nChunkSize + p->nEntriesAlloc;
  }
  p->nEntriesUsed = p->nEntriesUsed + 1;
  if (p->nEntriesMax < p->nEntriesUsed) {
    p->nEntriesMax = p->nEntriesUsed;
  }
  pcVar2 = p->pEntriesFree;
  p->pEntriesFree = *(char **)pcVar2;
  return pcVar2;
}

Assistant:

char * Gia_MmFixedEntryFetch( Gia_MmFixed_t * p )
{
    char * pTemp;
    int i;

    // check if there are still free entries
    if ( p->nEntriesUsed == p->nEntriesAlloc )
    { // need to allocate more entries
        assert( p->pEntriesFree == NULL );
        if ( p->nChunks == p->nChunksAlloc )
        {
            p->nChunksAlloc *= 2;
            p->pChunks = ABC_REALLOC( char *, p->pChunks, p->nChunksAlloc ); 
        }
        p->pEntriesFree = ABC_ALLOC( char, p->nEntrySize * p->nChunkSize );
        p->nMemoryAlloc += p->nEntrySize * p->nChunkSize;
        // transform these entries into a linked list
        pTemp = p->pEntriesFree;
        for ( i = 1; i < p->nChunkSize; i++ )
        {
            *((char **)pTemp) = pTemp + p->nEntrySize;
            pTemp += p->nEntrySize;
        }
        // set the last link
        *((char **)pTemp) = NULL;
        // add the chunk to the chunk storage
        p->pChunks[ p->nChunks++ ] = p->pEntriesFree;
        // add to the number of entries allocated
        p->nEntriesAlloc += p->nChunkSize;
    }
    // incrememt the counter of used entries
    p->nEntriesUsed++;
    if ( p->nEntriesMax < p->nEntriesUsed )
        p->nEntriesMax = p->nEntriesUsed;
    // return the first entry in the free entry list
    pTemp = p->pEntriesFree;
    p->pEntriesFree = *((char **)pTemp);
    return pTemp;
}